

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Matrix * MatrixSubtract(Matrix left,Matrix right)

{
  Matrix *in_RDI;
  
  in_RDI->m0 = left.m0 - right.m0;
  in_RDI->m4 = left.m4 - right.m4;
  in_RDI->m8 = left.m8 - right.m8;
  in_RDI->m12 = left.m12 - right.m12;
  in_RDI->m1 = left.m1 - right.m1;
  in_RDI->m5 = left.m5 - right.m5;
  in_RDI->m9 = left.m9 - right.m9;
  in_RDI->m13 = left.m13 - right.m13;
  in_RDI->m2 = left.m2 - right.m2;
  in_RDI->m6 = left.m6 - right.m6;
  in_RDI->m10 = left.m10 - right.m10;
  in_RDI->m14 = left.m14 - right.m14;
  in_RDI->m3 = left.m3 - right.m3;
  in_RDI->m7 = left.m7 - right.m7;
  in_RDI->m11 = left.m11 - right.m11;
  in_RDI->m15 = left.m15 - right.m15;
  return in_RDI;
}

Assistant:

RMAPI Matrix MatrixSubtract(Matrix left, Matrix right)
{
    Matrix result = { 0 };

    result.m0 = left.m0 - right.m0;
    result.m1 = left.m1 - right.m1;
    result.m2 = left.m2 - right.m2;
    result.m3 = left.m3 - right.m3;
    result.m4 = left.m4 - right.m4;
    result.m5 = left.m5 - right.m5;
    result.m6 = left.m6 - right.m6;
    result.m7 = left.m7 - right.m7;
    result.m8 = left.m8 - right.m8;
    result.m9 = left.m9 - right.m9;
    result.m10 = left.m10 - right.m10;
    result.m11 = left.m11 - right.m11;
    result.m12 = left.m12 - right.m12;
    result.m13 = left.m13 - right.m13;
    result.m14 = left.m14 - right.m14;
    result.m15 = left.m15 - right.m15;

    return result;
}